

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketConnection::ThreadedSocketConnection
          (ThreadedSocketConnection *this,socket_handle s,Sessions *sessions,Log *pLog)

{
  Log *pLog_local;
  Sessions *sessions_local;
  socket_handle s_local;
  ThreadedSocketConnection *this_local;
  
  Responder::Responder(&this->super_Responder);
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__ThreadedSocketConnection_00331648;
  this->m_socket = s;
  std::__cxx11::string::string((string *)&this->m_address);
  std::__cxx11::string::string((string *)&this->m_sourceAddress);
  this->m_pLog = pLog;
  Parser::Parser(&this->m_parser);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_sessions,sessions);
  this->m_pSession = (Session *)0x0;
  this->m_disconnect = false;
  return;
}

Assistant:

ThreadedSocketConnection::ThreadedSocketConnection(socket_handle s, Sessions sessions, Log *pLog)
    : m_socket(s),
      m_pLog(pLog),
      m_sessions(sessions),
      m_pSession(0),
      m_disconnect(false) {
#if _MSC_VER
  FD_ZERO(&m_fds);
  FD_SET(m_socket, &m_fds);
#endif
}